

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O0

char * hist_lev_name(d_level *l,boolean in_or_on)

{
  boolean bVar1;
  char *pcVar2;
  char *bufptr;
  boolean in_or_on_local;
  d_level *l_local;
  
  if (l->dnum == dungeon_topology.d_astral_level.dnum) {
    bVar1 = on_level(l,&dungeon_topology.d_astral_level);
    if (bVar1 == '\0') {
      bVar1 = on_level(l,&dungeon_topology.d_earth_level);
      if (bVar1 == '\0') {
        bVar1 = on_level(l,&dungeon_topology.d_air_level);
        if (bVar1 == '\0') {
          bVar1 = on_level(l,&dungeon_topology.d_fire_level);
          if (bVar1 == '\0') {
            bVar1 = on_level(l,&dungeon_topology.d_water_level);
            if (bVar1 == '\0') {
              sprintf(hist_lev_name::hlnbuf,"on the Plane of %d",(ulong)(uint)(int)l->dlevel);
            }
            else {
              strcpy(hist_lev_name::hlnbuf,"on the Plane of Water");
            }
          }
          else {
            strcpy(hist_lev_name::hlnbuf,"on the Plane of Fire");
          }
        }
        else {
          strcpy(hist_lev_name::hlnbuf,"on the Plane of Air");
        }
      }
      else {
        strcpy(hist_lev_name::hlnbuf,"on the Astral Plane");
      }
    }
    else {
      strcpy(hist_lev_name::hlnbuf,"on the Astral Plane");
    }
  }
  else {
    bVar1 = on_level(l,&dungeon_topology.d_knox_level);
    if (bVar1 == '\0') {
      bVar1 = on_level(l,&dungeon_topology.d_stronghold_level);
      if (bVar1 == '\0') {
        bVar1 = on_level(l,&dungeon_topology.d_valley_level);
        if (bVar1 == '\0') {
          sprintf(hist_lev_name::hlnbuf,"on level %d of %s",(ulong)(uint)(int)l->dlevel,
                  dungeons + l->dnum);
        }
        else {
          strcpy(hist_lev_name::hlnbuf,"in The Valley of the Dead");
        }
      }
      else {
        strcpy(hist_lev_name::hlnbuf,"in The Castle");
      }
    }
    else {
      strcpy(hist_lev_name::hlnbuf,"in Fort Knox");
    }
  }
  pcVar2 = hist_lev_name::hlnbuf + 3;
  if (in_or_on != '\0') {
    pcVar2 = hist_lev_name::hlnbuf;
  }
  return pcVar2;
}

Assistant:

const char *hist_lev_name(const d_level *l, boolean in_or_on)
{
    static char hlnbuf[BUFSZ];
    char *bufptr;
    
    if (In_endgame(l)) {
	if      (Is_astralevel(l))	strcpy(hlnbuf, "on the Astral Plane");
	else if (Is_earthlevel(l))	strcpy(hlnbuf, "on the Astral Plane");
	else if (Is_airlevel(l))	strcpy(hlnbuf, "on the Plane of Air");
	else if (Is_firelevel(l))	strcpy(hlnbuf, "on the Plane of Fire");
	else if (Is_waterlevel(l))	strcpy(hlnbuf, "on the Plane of Water");
	else sprintf(hlnbuf, "on the Plane of %d", l->dlevel);
    }
    else if (Is_knox(l))
	strcpy(hlnbuf, "in Fort Knox");
    else if (Is_stronghold(l))
	strcpy(hlnbuf, "in The Castle");
    else if (Is_valley(l))
	strcpy(hlnbuf, "in The Valley of the Dead");
    else
	sprintf(hlnbuf, "on level %d of %s", l->dlevel, dungeons[l->dnum].dname);
    
    bufptr = in_or_on? hlnbuf : (hlnbuf + 3);
    return bufptr;
}